

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-emscripten.cpp
# Opt level: O1

Global * wasm::getStackPointerGlobal(Module *wasm)

{
  pointer puVar1;
  Global *pGVar2;
  Global *in_RAX;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *g_1;
  pointer puVar3;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *g;
  pointer puVar4;
  bool bVar5;
  bool bVar6;
  
  puVar3 = (wasm->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (wasm->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar5 = puVar3 == puVar1;
  if (!bVar5) {
    in_RAX = (Global *)&STACK_POINTER;
    puVar4 = puVar3;
    do {
      pGVar2 = (puVar4->_M_t).
               super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
               super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      if (*(char **)((long)&(pGVar2->super_Importable).module + 8) == (char *)0x0) {
        bVar6 = true;
      }
      else {
        bVar6 = *(char **)((long)&(pGVar2->super_Importable).base + 8) != DAT_010d2628;
        if (!bVar6) {
          in_RAX = pGVar2;
        }
      }
      if (!bVar6) break;
      puVar4 = puVar4 + 1;
      bVar5 = puVar4 == puVar1;
    } while (!bVar5);
  }
  if (bVar5) {
    for (; puVar3 != puVar1; puVar3 = puVar3 + 1) {
      pGVar2 = (puVar3->_M_t).
               super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
               super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      if (*(char **)((long)&(pGVar2->super_Importable).module + 8) == (char *)0x0) {
        return pGVar2;
      }
    }
    in_RAX = (Global *)0x0;
  }
  return in_RAX;
}

Assistant:

Global* getStackPointerGlobal(Module& wasm) {
  // Assumption: The stack pointer is either imported as __stack_pointer or
  // we just assume it's the first non-imported global.
  // TODO(sbc): Find a better way to discover the stack pointer.  Perhaps the
  // linker could export it by name?
  for (auto& g : wasm.globals) {
    if (g->imported() && g->base == STACK_POINTER) {
      return g.get();
    }
  }
  for (auto& g : wasm.globals) {
    if (!g->imported()) {
      return g.get();
    }
  }
  return nullptr;
}